

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O0

int borg_perma_aux_fastcast(void)

{
  _Bool _Var1;
  int iVar2;
  int local_1c;
  int local_10;
  int cost;
  int fail_allowed;
  
  local_10 = 5;
  if (unique_on_level != 0) {
    local_10 = 10;
  }
  if (borg_fighting_unique != L'\0') {
    local_10 = 0xf;
  }
  if (borg.temp.fastcast) {
    cost = 0;
  }
  else if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
    _Var1 = borg_spell_okay_fail(MANA_CHANNEL,local_10);
    if (_Var1) {
      iVar2 = borg_get_spell_power(MANA_CHANNEL);
      if (unique_on_level == 0) {
        local_1c = borg.trait[0x1e] / 10;
      }
      else {
        local_1c = borg.trait[0x1e] / 7;
      }
      if (iVar2 < local_1c) {
        if ((borg_simulate & 1U) == 0) {
          _Var1 = borg_spell(MANA_CHANNEL);
          if (_Var1) {
            borg.no_rest_prep = 6000;
            cost = 1;
          }
          else {
            cost = 0;
          }
        }
        else {
          cost = 5;
        }
      }
      else {
        cost = 0;
      }
    }
    else {
      cost = 0;
    }
  }
  else {
    cost = 0;
  }
  return cost;
}

Assistant:

static int borg_perma_aux_fastcast(void)
{
    int fail_allowed = 5, cost;

    /* increase the threshold */
    if (unique_on_level)
        fail_allowed = 10;
    if (borg_fighting_unique)
        fail_allowed = 15;

    /* already fast */
    if (borg.temp.fastcast)
        return 0;

    /* Cant when Blind */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return 0;

    if (!borg_spell_okay_fail(MANA_CHANNEL, fail_allowed))
        return 0;

    /* Obtain the cost of the spell */
    cost = borg_get_spell_power(MANA_CHANNEL);

    /* If its cheap, go ahead */
    if (cost >= ((unique_on_level) ? borg.trait[BI_CURSP] / 7
                                   : borg.trait[BI_CURSP] / 10))
        return 0;

    /* Simulation */
    /* fastcast is a low priority */
    if (borg_simulate)
        return 5;

    /* do it! */
    if (borg_spell(MANA_CHANNEL)) {
        /* No resting to recoup mana */
        borg.no_rest_prep = 6000;
        return 1;
    }

    return 0;
}